

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.cpp
# Opt level: O0

QString * __thiscall
CsvModelSerialiserPrivate::unescapedCSV
          (QString *__return_storage_ptr__,CsvModelSerialiserPrivate *this,QString *exc)

{
  bool bVar1;
  const_iterator pQVar2;
  QArrayDataPointer<char16_t> local_d0;
  QString local_b8;
  QArrayDataPointer<char16_t> local_90;
  QString local_78;
  QLatin1Char local_5b;
  QChar local_5a;
  QChar local_58;
  QLatin1Char local_55;
  QChar local_54;
  QChar local_52;
  QString *local_50;
  QString *exc_local;
  CsvModelSerialiserPrivate *this_local;
  char16_t *local_38;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_28;
  char16_t *local_20;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_10;
  
  local_50 = exc;
  exc_local = (QString *)this;
  this_local = (CsvModelSerialiserPrivate *)__return_storage_ptr__;
  bVar1 = QString::isEmpty(exc);
  if (bVar1) {
    QString::QString(__return_storage_ptr__,exc);
  }
  else {
    pQVar2 = QString::constBegin(exc);
    local_52.ucs = pQVar2->ucs;
    QLatin1Char::QLatin1Char(&local_55,'\"');
    QChar::QChar(&local_54,local_55);
    bVar1 = ::operator==(local_52,local_54);
    if (bVar1) {
      pQVar2 = QString::constEnd(exc);
      local_58.ucs = pQVar2[-1].ucs;
      QLatin1Char::QLatin1Char(&local_5b,'\"');
      QChar::QChar(&local_5a,local_5b);
      bVar1 = ::operator==(local_58,local_5a);
      if (bVar1) {
        QString::chop((longlong)exc);
        QString::remove((longlong)exc,0);
        str = L"\"\"";
        local_38 = L"\"\"";
        local_28 = &local_90;
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_90,(Data *)0x0,L"\"\"",2);
        QString::QString(&local_78,&local_90);
        local_10 = &local_d0;
        str_1 = L"\"";
        local_20 = L"\"";
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_d0,(Data *)0x0,L"\"",1);
        QString::QString(&local_b8,&local_d0);
        QString::replace((QString *)exc,(QString *)&local_78,(CaseSensitivity)&local_b8);
        QString::~QString(&local_b8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
        QString::~QString(&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      }
    }
    QString::QString(__return_storage_ptr__,exc);
  }
  return __return_storage_ptr__;
}

Assistant:

QString CsvModelSerialiserPrivate::unescapedCSV(QString exc) const
{
    if (exc.isEmpty())
        return exc;
    if (*exc.constBegin() == QLatin1Char('\"') && *(exc.constEnd() - 1) == QLatin1Char('\"')) {
        exc.chop(1);
        exc.remove(0, 1);
        exc.replace(QStringLiteral("\"\""), QStringLiteral("\""));
    }
    return exc;
}